

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O3

void __thiscall bvh::v2::ThreadPool::ThreadPool(ThreadPool *this,size_t thread_count)

{
  queue<std::function<void_(unsigned_long)>,_std::deque<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>_>
  *this_00;
  int iVar1;
  unsigned_long local_58;
  queue<std::function<void_(unsigned_long)>,_std::deque<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>_>
  *local_50;
  condition_variable *local_48;
  condition_variable *local_40;
  ThreadPool *local_38;
  
  this->busy_count_ = 0;
  this->should_stop_ = false;
  local_40 = &this->avail_;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::condition_variable::condition_variable(local_40);
  local_48 = &this->done_;
  std::condition_variable::condition_variable(local_48);
  this_00 = &this->tasks_;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->tasks_).c.
  super__Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::
  _Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ::_M_initialize_map((_Deque_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
                       *)this_00,0);
  local_50 = this_00;
  if (thread_count == 0) {
    iVar1 = std::thread::hardware_concurrency();
    thread_count = (size_t)(iVar1 + (uint)(iVar1 == 0));
  }
  local_58 = 0;
  do {
    local_38 = this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(bvh::v2::ThreadPool*,unsigned_long),bvh::v2::ThreadPool*,unsigned_long&>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->threads_,worker,&local_38,
               &local_58);
    local_58 = local_58 + 1;
  } while (local_58 < thread_count);
  return;
}

Assistant:

ThreadPool(size_t thread_count = 0) { start(thread_count); }